

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

void __thiscall kratos::AssertValueStmt::AssertValueStmt(AssertValueStmt *this)

{
  shared_ptr<kratos::Var> local_40;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  Const::constant(0,1,false);
  Var::as<kratos::Const>((Var *)&stack0xffffffffffffffd0);
  local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
  local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (element_type *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AssertValueStmt(this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffd8);
  return;
}

Assistant:

AssertValueStmt::AssertValueStmt() : AssertValueStmt(constant(0, 1).as<Const>()) {}